

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O3

int pigpio_command_ext(int pi,int command,int p1,int p2,int p3,int extents,gpioExtent_t *ext,int rl)

{
  pthread_mutex_t *__mutex;
  ssize_t sVar1;
  int iVar2;
  long lVar3;
  int cancelState;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  local_34 = -0x7db;
  if (((uint)pi < 0x20) && (gPiInUse[(uint)pi] != 0)) {
    local_40 = command;
    local_3c = p1;
    local_38 = p2;
    local_34 = p3;
    pthread_setcancelstate(1,&local_44);
    __mutex = gCmdMutex + (uint)pi;
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    gCancelState[(uint)pi] = local_44;
    sVar1 = send(gPigCommand[(uint)pi],&local_40,0x10,0);
    if (sVar1 == 0x10) {
      if (0 < extents) {
        lVar3 = 0;
        do {
          sVar1 = send(gPigCommand[(uint)pi],*(void **)((long)&ext->ptr + lVar3),
                       *(size_t *)((long)&ext->size + lVar3),0);
          if (sVar1 != *(long *)((long)&ext->size + lVar3)) {
            iVar2 = gCancelState[(uint)pi];
            goto LAB_00106033;
          }
          lVar3 = lVar3 + 0x18;
        } while ((ulong)(uint)extents * 0x18 != lVar3);
      }
      sVar1 = recv(gPigCommand[(uint)pi],&local_40,0x10,0x100);
      if (sVar1 == 0x10) {
        if (rl != 0) {
          iVar2 = gCancelState[(uint)pi];
          pthread_mutex_unlock((pthread_mutex_t *)__mutex);
          pthread_setcancelstate(iVar2,(int *)0x0);
        }
      }
      else {
        iVar2 = gCancelState[(uint)pi];
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        pthread_setcancelstate(iVar2,(int *)0x0);
        local_34 = -0x7d1;
      }
    }
    else {
      iVar2 = gCancelState[(uint)pi];
LAB_00106033:
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      pthread_setcancelstate(iVar2,(int *)0x0);
      local_34 = -2000;
    }
  }
  return local_34;
}

Assistant:

static int pigpio_command_ext
   (int pi, int command, int p1, int p2, int p3,
    int extents, gpioExtent_t *ext, int rl)
{
   int i;
   cmdCmd_t cmd;

   if ((pi < 0) || (pi >= MAX_PI) || !gPiInUse[pi])
      return pigif_unconnected_pi;

   cmd.cmd = command;
   cmd.p1  = p1;
   cmd.p2  = p2;
   cmd.p3  = p3;

   _pml(pi);

   if (send(gPigCommand[pi], &cmd, sizeof(cmd), 0) != sizeof(cmd))
   {
      _pmu(pi);
      return pigif_bad_send;
   }

   for (i=0; i<extents; i++)
   {
      if (send(gPigCommand[pi], ext[i].ptr, ext[i].size, 0) != ext[i].size)
      {
         _pmu(pi);
         return pigif_bad_send;
      }
   }

   if (recv(gPigCommand[pi], &cmd, sizeof(cmd), MSG_WAITALL) != sizeof(cmd))
   {
      _pmu(pi);
      return pigif_bad_recv;
   }
   if (rl) _pmu(pi);

   return cmd.res;
}